

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
despot::Variable::ComputeIndexVec
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *vars,int index)

{
  pointer piVar1;
  pointer ppNVar2;
  NamedVar *pNVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)(vars->
                   super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(vars->
                   super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_19);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (int)((ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2) - 1;
  if (-1 < (int)uVar5) {
    ppNVar2 = (vars->super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar6 = (ulong)uVar5 + 1;
    do {
      pNVar3 = ppNVar2[lVar6 + -1];
      iVar8 = (int)((ulong)((long)*(pointer *)
                                   ((long)&(pNVar3->super_Variable).values_.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   + 8) -
                           *(long *)&(pNVar3->super_Variable).values_.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data) >> 5);
      piVar1[lVar6 + -1] = index % iVar8;
      lVar7 = lVar6 + -1;
      bVar4 = 0 < lVar6;
      lVar6 = lVar7;
      index = index / iVar8;
    } while (lVar7 != 0 && bVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Variable::ComputeIndexVec(const vector<NamedVar*>& vars,
	int index) {
	vector<int> vec(vars.size());
	for (int i = vec.size() - 1; i >= 0; i--) {
		vec[i] = index % vars[i]->Size();
		index /= vars[i]->Size();
	}

	return vec;
}